

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSample::Deserialize(LogicalSample *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  LogicalSample *this_00;
  pointer pLVar3;
  _Head_base<0UL,_duckdb::LogicalSample_*,_false> local_40;
  pointer local_38;
  pointer local_30;
  
  this_00 = (LogicalSample *)operator_new(0x70);
  LogicalSample(this_00);
  local_40._M_head_impl = this_00;
  pLVar3 = unique_ptr<duckdb::LogicalSample,_std::default_delete<duckdb::LogicalSample>,_true>::
           operator->((unique_ptr<duckdb::LogicalSample,_std::default_delete<duckdb::LogicalSample>,_true>
                       *)&local_40);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"sample_options");
  if ((char)uVar1 == '\0') {
    local_30 = (pointer)0x0;
  }
  else {
    local_38 = (pointer)0x0;
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      local_30 = (pointer)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      SampleOptions::Deserialize((SampleOptions *)&local_30,deserializer);
      local_38 = local_30;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  }
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pLVar3->sample_options,local_30);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSample::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalSample>(new LogicalSample());
	deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(200, "sample_options", result->sample_options);
	return std::move(result);
}